

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffgtkn(fitsfile *fptr,int numkey,char *name,long *value,int *status)

{
  int iVar1;
  int iVar2;
  char valuestring [71];
  char keyname [75];
  char comm [73];
  char message [81];
  char local_168 [80];
  char local_118 [80];
  char local_c8 [80];
  char local_78 [88];
  
  if (0 < *status) {
    return *status;
  }
  local_118[0] = '\0';
  local_168[0] = '\0';
  iVar1 = ffgkyn(fptr,numkey,local_118,local_168,local_c8,status);
  if (0 < iVar1) goto LAB_0017b68b;
  iVar1 = strcmp(local_118,name);
  iVar2 = 0xd0;
  if (iVar1 == 0) {
    ffc2ii(local_168,value,status);
    iVar2 = 0xd1;
    if ((0 < *status) || (*value < 0)) goto LAB_0017b615;
  }
  else {
LAB_0017b615:
    *status = iVar2;
  }
  if (0 < *status) {
    snprintf(local_78,0x51,"ffgtkn found unexpected keyword or value for keyword no. %d.",numkey);
    ffpmsg(local_78);
    snprintf(local_78,0x51," Expected positive integer keyword %s, but instead",name);
    ffpmsg(local_78);
    snprintf(local_78,0x51," found keyword %s with value %s",local_118,local_168);
    ffpmsg(local_78);
  }
LAB_0017b68b:
  return *status;
}

Assistant:

int ffgtkn(fitsfile *fptr,  /* I - FITS file pointer              */
           int numkey,      /* I - number of the keyword to read  */
           char *name,      /* I - expected name of the keyword   */
           long *value,     /* O - integer value of the keyword   */
           int *status)     /* IO - error status                  */
{
/*
  test that keyword number NUMKEY has the expected name and get the
  integer value of the keyword.  Return an error if the keyword
  name does not match the input name, or if the value of the
  keyword is not a positive integer.
*/
    char keyname[FLEN_KEYWORD], valuestring[FLEN_VALUE];
    char comm[FLEN_COMMENT], message[FLEN_ERRMSG];
   
    if (*status > 0)
        return(*status);
    
    keyname[0] = '\0';
    valuestring[0] = '\0';

    if (ffgkyn(fptr, numkey, keyname, valuestring, comm, status) <= 0)
    {
        if (strcmp(keyname, name) )
            *status = BAD_ORDER;  /* incorrect keyword name */

        else
        {
            ffc2ii(valuestring, value, status);  /* convert to integer */

            if (*status > 0 || *value < 0 )
               *status = NOT_POS_INT;
        }

        if (*status > 0)
        {
            snprintf(message, FLEN_ERRMSG,
              "ffgtkn found unexpected keyword or value for keyword no. %d.",
              numkey);
            ffpmsg(message);

            snprintf(message, FLEN_ERRMSG,
              " Expected positive integer keyword %s, but instead", name);
            ffpmsg(message);

            snprintf(message, FLEN_ERRMSG,
              " found keyword %s with value %s", keyname, valuestring);
            ffpmsg(message);
        }
    }

    return(*status);
}